

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

void __thiscall FIX::Initiator::setConnected(Initiator *this,SessionID *sessionID)

{
  Locker local_20;
  Locker l;
  SessionID *sessionID_local;
  Initiator *this_local;
  
  l.m_mutex = (Mutex *)sessionID;
  Locker::Locker(&local_20,&this->m_mutex);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::erase
            (&this->m_pending,(key_type *)l.m_mutex);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::insert
            (&this->m_connected,(value_type *)l.m_mutex);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::erase
            (&this->m_disconnected,(key_type *)l.m_mutex);
  Locker::~Locker(&local_20);
  return;
}

Assistant:

void Initiator::setConnected(const SessionID &sessionID) {
  Locker l(m_mutex);

  m_pending.erase(sessionID);
  m_connected.insert(sessionID);
  m_disconnected.erase(sessionID);
}